

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O1

int zt_ptr_array_move_idx_to_idx(zt_ptr_array *array,int32_t src_idx,int32_t dst_idx)

{
  int iVar1;
  
  iVar1 = -1;
  if (dst_idx <= array->count && src_idx <= array->count) {
    array->array[dst_idx] = array->array[src_idx];
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
zt_ptr_array_move_idx_to_idx(zt_ptr_array * array, int32_t src_idx, int32_t dst_idx) {
    if (src_idx > array->count) {
        return -1;
    }

    if (dst_idx > array->count) {
        return -1;
    }

    array->array[dst_idx] = array->array[src_idx];

    return 0;
}